

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunadaptcontroller_soderlind.c
# Opt level: O3

SUNErrCode SUNAdaptController_SetParams_ImpGus(SUNAdaptController C,sunrealtype k1,sunrealtype k2)

{
  double *pdVar1;
  
  pdVar1 = (double *)C->content;
  *pdVar1 = k1 + k2;
  pdVar1[1] = -k2;
  pdVar1[2] = 0.0;
  pdVar1[3] = 1.0;
  pdVar1[4] = 0.0;
  return 0;
}

Assistant:

SUNErrCode SUNAdaptController_SetParams_ImpGus(SUNAdaptController C,
                                               sunrealtype k1, sunrealtype k2)
{
  SUNFunctionBegin(C->sunctx);
  SODERLIND_K1(C) = k1 + k2;
  SODERLIND_K2(C) = -k2;
  SODERLIND_K3(C) = SUN_RCONST(0.0);
  SODERLIND_K4(C) = SUN_RCONST(1.0);
  SODERLIND_K5(C) = SUN_RCONST(0.0);
  return SUN_SUCCESS;
}